

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogDispatcher::dispatch(LogDispatcher *this)

{
  bool bVar1;
  Logger *pLVar2;
  element_type *peVar3;
  PreRollOutCallback *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  *h;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
  *__range2;
  LogDispatchData data;
  LogDispatchCallback *callback;
  TypedConfigurations *tc;
  undefined4 in_stack_ffffffffffffff58;
  LoggingFlag in_stack_ffffffffffffff5c;
  TypedConfigurations *in_stack_ffffffffffffff60;
  Level in_stack_ffffffffffffff7c;
  TypedConfigurations *in_stack_ffffffffffffff80;
  undefined1 local_78 [32];
  __shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  undefined1 *local_48;
  _Self local_40;
  _Self local_38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
  *local_30;
  LogDispatchData local_28;
  element_type *local_18;
  TypedConfigurations *local_10;
  
  if ((((in_RDI->super__Function_base)._M_functor._M_pod_data[0] & 1U) != 0) &&
     (*(int *)((long)&in_RDI[4].super__Function_base._M_functor + 8) == 1)) {
    (in_RDI->super__Function_base)._M_functor._M_pod_data[0] = '\0';
  }
  if (((in_RDI->super__Function_base)._M_functor._M_pod_data[0] & 1U) != 0) {
    pLVar2 = LogMessage::logger((LogMessage *)((long)&(in_RDI->super__Function_base)._M_functor + 8)
                               );
    local_10 = pLVar2->m_typedConfigurations;
    std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x272fbc);
    bVar1 = Storage::hasFlag((Storage *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    if (bVar1) {
      in_stack_ffffffffffffff60 = local_10;
      LogMessage::level((LogMessage *)((long)&(in_RDI->super__Function_base)._M_functor + 8));
      peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x272ffa);
      Storage::preRollOutCallback(peVar3);
      TypedConfigurations::validateFileRolling
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_RDI);
    }
    local_18 = (element_type *)0x0;
    LogDispatchData::LogDispatchData(&local_28);
    peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x273038);
    local_30 = &peVar3->m_logDispatchCallbacks;
    local_38._M_node =
         (_Base_ptr)
         utils::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_40._M_node =
         (_Base_ptr)
         utils::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while (bVar1 = utils::std::operator!=(&local_38,&local_40), bVar1) {
      utils::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>
                   *)0x273083);
      utils::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
                  *)in_stack_ffffffffffffff60,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
                  *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_48 = local_78;
      local_18 = utils::std::__shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>::get
                           (&_Stack_58);
      if (local_18 != (element_type *)0x0) {
        bVar1 = Callback<el::LogDispatchData>::enabled
                          (&local_18->super_Callback<el::LogDispatchData>);
        in_stack_ffffffffffffff5c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
        if (bVar1) {
          LogDispatchData::setLogMessage
                    (&local_28,(LogMessage *)((long)&(in_RDI->super__Function_base)._M_functor + 8))
          ;
          LogDispatchData::setDispatchAction
                    (&local_28,
                     *(DispatchAction *)((long)&in_RDI[4].super__Function_base._M_functor + 8));
          (*(local_18->super_Callback<el::LogDispatchData>).super_ThreadSafe._vptr_ThreadSafe[5])
                    (local_18,&local_28);
        }
      }
      utils::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
               *)in_stack_ffffffffffffff60);
      utils::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>
                    *)in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

void LogDispatcher::dispatch(void) {
  if (m_proceed && m_dispatchAction == base::DispatchAction::None) {
    m_proceed = false;
  }
  if (!m_proceed) {
    return;
  }
  base::TypedConfigurations* tc = m_logMessage.logger()->m_typedConfigurations;
  if (ELPP->hasFlag(LoggingFlag::StrictLogFileSizeCheck)) {
    tc->validateFileRolling(m_logMessage.level(), ELPP->preRollOutCallback());
  }
  LogDispatchCallback* callback = nullptr;
  LogDispatchData data;
  for (const std::pair<std::string, base::type::LogDispatchCallbackPtr>& h
       : ELPP->m_logDispatchCallbacks) {
    callback = h.second.get();
    if (callback != nullptr && callback->enabled()) {
      data.setLogMessage(&m_logMessage);
      data.setDispatchAction(m_dispatchAction);
      callback->handle(&data);
    }
  }
}